

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O2

string * __thiscall
CLI::Option::help_aftername_abi_cxx11_(string *__return_storage_ptr__,Option *this)

{
  Option *pOVar1;
  int iVar2;
  ostream *poVar3;
  _Rb_tree_node_base *p_Var4;
  _Base_ptr p_Var5;
  stringstream out;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  if (this->expected_ != 0) {
    if ((this->typeval_)._M_string_length != 0) {
      poVar3 = ::std::operator<<(local_1a8," ");
      ::std::operator<<(poVar3,(string *)&this->typeval_);
    }
    if ((this->defaultval_)._M_string_length != 0) {
      poVar3 = ::std::operator<<(local_1a8,"=");
      ::std::operator<<(poVar3,(string *)&this->defaultval_);
    }
    iVar2 = this->expected_;
    if (1 < iVar2) {
      poVar3 = ::std::operator<<(local_1a8," x ");
      ::std::ostream::operator<<((ostream *)poVar3,this->expected_);
      iVar2 = this->expected_;
    }
    if (iVar2 == -1) {
      ::std::operator<<(local_1a8," ...");
    }
  }
  if ((this->envname_)._M_string_length != 0) {
    poVar3 = ::std::operator<<(local_1a8," (env:");
    poVar3 = ::std::operator<<(poVar3,(string *)&this->envname_);
    ::std::operator<<(poVar3,")");
  }
  if ((this->requires_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    ::std::operator<<(local_1a8," Requires:");
    for (p_Var4 = (this->requires_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(this->requires_)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var4)) {
      pOVar1 = *(Option **)(p_Var4 + 1);
      poVar3 = ::std::operator<<(local_1a8," ");
      get_name_abi_cxx11_(&local_1d8,pOVar1,false);
      ::std::operator<<(poVar3,(string *)&local_1d8);
      ::std::__cxx11::string::~string((string *)&local_1d8);
    }
  }
  if ((this->excludes_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    ::std::operator<<(local_1a8," Excludes:");
    for (p_Var5 = (this->excludes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &(this->excludes_)._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Base_ptr)::std::_Rb_tree_increment(p_Var5)) {
      pOVar1 = *(Option **)(p_Var5 + 1);
      poVar3 = ::std::operator<<(local_1a8," ");
      get_name_abi_cxx11_(&local_1d8,pOVar1,false);
      ::std::operator<<(poVar3,(string *)&local_1d8);
      ::std::__cxx11::string::~string((string *)&local_1d8);
    }
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string help_aftername() const {
        std::stringstream out;

        if(get_expected() != 0) {
            if(!typeval_.empty())
                out << " " << typeval_;
            if(!defaultval_.empty())
                out << "=" << defaultval_;
            if(get_expected() > 1)
                out << " x " << get_expected();
            if(get_expected() == -1)
                out << " ...";
        }
        if(!envname_.empty())
            out << " (env:" << envname_ << ")";
        if(!requires_.empty()) {
            out << " Requires:";
            for(const Option *opt : requires_)
                out << " " << opt->get_name();
        }
        if(!excludes_.empty()) {
            out << " Excludes:";
            for(const Option *opt : excludes_)
                out << " " << opt->get_name();
        }
        return out.str();
    }